

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O0

void __thiscall ASDCP::MXF::DescriptiveFramework::Dump(DescriptiveFramework *this,FILE *stream)

{
  undefined8 __stream;
  bool bVar1;
  UUID *this_00;
  char *pcVar2;
  char local_98 [8];
  char identbuf [128];
  FILE *stream_local;
  DescriptiveFramework *this_local;
  
  local_98[0] = '\0';
  identbuf._120_8_ = stream;
  if (stream == (FILE *)0x0) {
    identbuf._120_8_ = _stderr;
  }
  InterchangeObject::Dump(&this->super_InterchangeObject,(FILE *)identbuf._120_8_);
  bVar1 = optional_property<Kumu::UUID>::empty(&this->LinkedDescriptiveFrameworkPlugInId);
  __stream = identbuf._120_8_;
  if (!bVar1) {
    this_00 = optional_property<Kumu::UUID>::get(&this->LinkedDescriptiveFrameworkPlugInId);
    pcVar2 = Kumu::UUID::EncodeString(this_00,local_98,0x80);
    fprintf((FILE *)__stream,"  %22s = %s\n","LinkedDescriptiveFrameworkPlugInId",pcVar2);
  }
  return;
}

Assistant:

void
DescriptiveFramework::Dump(FILE* stream)
{
  char identbuf[IdentBufferLen];
  *identbuf = 0;

  if ( stream == 0 )
    stream = stderr;

  InterchangeObject::Dump(stream);
  if ( ! LinkedDescriptiveFrameworkPlugInId.empty() ) {
    fprintf(stream, "  %22s = %s\n",  "LinkedDescriptiveFrameworkPlugInId", LinkedDescriptiveFrameworkPlugInId.get().EncodeString(identbuf, IdentBufferLen));
  }
}